

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

SshChannel * wrap_lportfwd_open(ConnectionLayer *cl,char *hostname,int port,Socket *s,Channel *chan)

{
  SocketPeerInfo *pi_00;
  SshChannel *pSVar1;
  SshChannel *toret;
  char *description;
  SocketPeerInfo *pi;
  Channel *chan_local;
  Socket *s_local;
  int port_local;
  char *hostname_local;
  ConnectionLayer *cl_local;
  
  pi_00 = sk_peer_info(s);
  if ((pi_00 == (SocketPeerInfo *)0x0) || (pi_00->log_text == (char *)0x0)) {
    toret = (SshChannel *)dupstr("forwarding");
  }
  else {
    toret = (SshChannel *)dupprintf("forwarding from %s",pi_00->log_text);
  }
  pSVar1 = ssh_lportfwd_open(cl,hostname,port,(char *)toret,pi_00,chan);
  sk_free_peer_info(pi_00);
  safefree(toret);
  return pSVar1;
}

Assistant:

static SshChannel *wrap_lportfwd_open(
    ConnectionLayer *cl, const char *hostname, int port,
    Socket *s, Channel *chan)
{
    SocketPeerInfo *pi;
    char *description;
    SshChannel *toret;

    pi = sk_peer_info(s);
    if (pi && pi->log_text) {
        description = dupprintf("forwarding from %s", pi->log_text);
    } else {
        description = dupstr("forwarding");
    }
    toret = ssh_lportfwd_open(cl, hostname, port, description, pi, chan);
    sk_free_peer_info(pi);

    sfree(description);
    return toret;
}